

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver_manager.cpp
# Opt level: O2

AdbcStatusCode ReleaseDriver(AdbcDriver *driver,AdbcError *error)

{
  undefined8 *puVar1;
  AdbcStatusCode AVar2;
  
  puVar1 = (undefined8 *)driver->private_manager;
  if (puVar1 == (undefined8 *)0x0) {
    AVar2 = '\0';
  }
  else {
    if ((code *)*puVar1 == (code *)0x0) {
      AVar2 = '\0';
    }
    else {
      AVar2 = (*(code *)*puVar1)(driver);
    }
    driver->private_manager = (void *)0x0;
    operator_delete(puVar1);
  }
  return AVar2;
}

Assistant:

static AdbcStatusCode ReleaseDriver(struct AdbcDriver *driver, struct AdbcError *error) {
	AdbcStatusCode status = ADBC_STATUS_OK;

	if (!driver->private_manager)
		return status;
	ManagerDriverState *state = reinterpret_cast<ManagerDriverState *>(driver->private_manager);

	if (state->driver_release) {
		status = state->driver_release(driver, error);
	}
	state->handle.Release();

	driver->private_manager = nullptr;
	delete state;
	return status;
}